

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,Type type)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  bool bVar4;
  SPxOut *pSVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  double local_150;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_148;
  Verbosity old_verbosity;
  uint uStack_134;
  uint auStack_130 [25];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  
  bVar19 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = &pSVar2->weights;
  this_01 = &pSVar2->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      if (pSVar2->weightsAreSetup == false) {
        iVar11 = (pSVar2->thecovectors->set).thenum;
        lVar16 = 0;
        lVar9 = 0;
      }
      else {
        iVar11 = (pSVar2->thecovectors->set).thenum;
        iVar7 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar2->coWeights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (iVar11 < iVar7) {
          iVar7 = iVar11;
        }
        iVar1 = (pSVar2->thevectors->set).thenum;
        iVar8 = (int)((ulong)((long)(pSVar2->weights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar2->weights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (iVar1 < iVar8) {
          iVar8 = iVar1;
        }
        lVar9 = (long)iVar7;
        lVar16 = (long)iVar8;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_01,iVar11,false);
      lVar17 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      lVar18 = lVar17 << 7;
      for (; lVar9 < lVar17; lVar17 = lVar17 + -1) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)(this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar18),2.0);
        lVar18 = lVar18 + -0x80;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_00,(((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->thevectors->set).thenum,false);
      lVar18 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thevectors->set).thenum;
      lVar9 = lVar18 << 7;
      for (; lVar16 < lVar18; lVar18 = lVar18 + -1) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)(this_00->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar9),1.0);
        lVar9 = lVar9 + -0x80;
      }
    }
    else {
      if (pSVar2->weightsAreSetup == false) {
        iVar11 = (pSVar2->thecovectors->set).thenum;
        lVar9 = 0;
      }
      else {
        iVar11 = (pSVar2->thecovectors->set).thenum;
        iVar7 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar2->coWeights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (iVar11 < iVar7) {
          iVar7 = iVar11;
        }
        lVar9 = (long)iVar7;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_01,iVar11,false);
      lVar18 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      lVar16 = lVar18 << 7;
      for (; lVar9 < lVar18; lVar18 = lVar18 + -1) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)(this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar16),1.0);
        lVar16 = lVar16 + -0x80;
      }
    }
  }
  else {
    pSVar5 = pSVar2->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
      old_verbosity = pSVar5->m_verbosity;
      tmp.super_IdxSet._vptr_IdxSet._0_4_ = 3;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<(((this->
                                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thesolver)->spxout,
                                  " --- initializing steepest edge multipliers");
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      pSVar5 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      (*pSVar5->_vptr_SPxOut[2])(pSVar5,&old_verbosity);
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(this_01,(((this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->thecovectors->set).thenum,false);
    if (type == ENTER) {
      uVar10 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->thecovectors->set).thenum;
      lVar9 = uVar10 << 7;
      while( true ) {
        if ((int)uVar10 < 1) break;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)(this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar9),1.0);
        uVar10 = (ulong)((int)uVar10 - 1);
        lVar9 = lVar9 + -0x80;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_00,(((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->thevectors->set).thenum,false);
      uVar10 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->thevectors->set).thenum;
      lVar9 = uVar10 * 0x10 + -1;
      while (0 < (int)uVar10) {
        local_150 = 1.0;
        pSVar3 = ((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->thevectors;
        lVar16 = uVar10 - 1;
        uVar10 = uVar10 - 1;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length2((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&tmp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((pSVar3->set).theitem + (pSVar3->set).thekey[lVar16].idx));
        local_c0._0_4_ = cpp_dec_float_finite;
        local_c0._4_4_ = 0x1c;
        old_verbosity = 0;
        uStack_134 = 0;
        auStack_130[0] = 0;
        auStack_130[1] = 0;
        auStack_130[2] = 0;
        auStack_130[3] = 0;
        auStack_130[4] = 0;
        auStack_130[5] = 0;
        auStack_130[6] = 0;
        auStack_130[7] = 0;
        auStack_130[8] = 0;
        auStack_130[9] = 0;
        auStack_130[10] = 0;
        auStack_130[0xb] = 0;
        auStack_130[0xc] = 0;
        auStack_130[0xd] = 0;
        auStack_130[0xe] = 0;
        auStack_130[0xf] = 0;
        auStack_130[0x10] = 0;
        auStack_130[0x11] = 0;
        auStack_130[0x12] = 0;
        auStack_130[0x13] = 0;
        auStack_130[0x14] = 0;
        auStack_130[0x15] = 0;
        auStack_130[0x16] = 0;
        auStack_130[0x17] = 0;
        stack0xffffffffffffff30 = 0;
        uStack_cb = 0;
        iStack_c8 = 0;
        bStack_c4 = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                   (cpp_dec_float<200U,_int,_void> *)&tmp,&local_150);
        puVar14 = (((this_00->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar9 * 2
        ;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
        puVar15 = puVar14 + 0xffffffffffffffe2;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *puVar15 = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        puVar14[0xfffffffffffffffe] = iStack_c8;
        *(bool *)(puVar14 + 0xffffffffffffffff) = bStack_c4;
        puVar14[0] = (fpclass_type)local_c0;
        puVar14[1] = local_c0._4_4_;
        lVar9 = lVar9 + -0x10;
      }
    }
    else {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar11 = (pSVar2->thecovectors->set).thenum;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_148,
                 &(pSVar2->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase(&tmp,iVar11,(shared_ptr<soplex::Tolerances> *)&local_148);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
      uVar10 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->thecovectors->set).thenum;
      lVar16 = uVar10 * 0x80 + -8;
      lVar9 = uVar10 * 0x98;
      while( true ) {
        if ((int)uVar10 < 1) break;
        bVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isTimeLimitReached
                          ((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,false);
        if (bVar4) break;
        pSVar2 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&pSVar2->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&tmp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)(pSVar2->unitVecs).data.
                                  super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].themem.val.m_backend
                                  .data._M_elems + lVar9 + -0x10));
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length2((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&old_verbosity,&tmp);
        puVar6 = (undefined8 *)
                 ((long)(((this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar16);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&old_verbosity;
        puVar14 = (uint *)(puVar6 + -0xf);
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar14 = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
          puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
        }
        *(int *)(puVar6 + -1) = iStack_c8;
        *(bool *)((long)puVar6 + -4) = bStack_c4;
        *puVar6 = local_c0;
        uVar10 = (ulong)((int)uVar10 - 1);
        lVar16 = lVar16 + -0x80;
        lVar9 = lVar9 + -0x98;
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase(&tmp);
    }
  }
  ((this->
   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thesolver)->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}